

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkAttachmentReference2 *att,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  bool bVar1;
  Data local_88;
  Value nexts;
  StringRefType local_68;
  StringRefType local_58;
  StringRefType local_48;
  StringRefType local_38;
  
  local_88.n.i64 = (Number)0x0;
  local_88.s.str = (Ch *)0x3000000000000;
  local_48.s = "attachment";
  local_48.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,&local_48,att->attachment,alloc);
  local_58.s = "layout";
  local_58.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkImageLayout>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,&local_58,att->layout,alloc);
  local_68.s = "aspectMask";
  local_68.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,&local_68,att->aspectMask,alloc);
  if (att->pNext != (void *)0x0) {
    nexts.data_.n = (Number)0x0;
    nexts.data_.s.str = (Ch *)0x0;
    bVar1 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (att->pNext,alloc,&nexts,(DynamicStateInfo *)0x0);
    if (!bVar1) {
      return false;
    }
    local_38.s = "pNext";
    local_38.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,&local_38,&nexts,alloc);
  }
  if (&local_88 != &out_value->data_) {
    (out_value->data_).n = local_88.n;
    (out_value->data_).s.str = local_88.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkAttachmentReference2 &att, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("attachment", att.attachment, alloc);
	value.AddMember("layout", att.layout, alloc);
	value.AddMember("aspectMask", att.aspectMask, alloc);
	if (!pnext_chain_add_json_value(value, att, alloc, nullptr))
		return false;

	*out_value = value;
	return true;
}